

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_window * nk_find_window(nk_context *ctx,nk_hash hash,char *name)

{
  long lVar1;
  nk_window *pnVar2;
  nk_window *pnVar3;
  int iVar4;
  long lVar5;
  
  pnVar3 = ctx->begin;
  while( true ) {
    pnVar2 = pnVar3;
    if (pnVar2 == (nk_window *)0x0) {
      return (nk_window *)0x0;
    }
    if (pnVar2 == pnVar2->next) break;
    pnVar3 = pnVar2->next;
    if (pnVar2->name == hash) {
      if (pnVar2->name_string[0] == '\0') {
        lVar5 = 0;
      }
      else {
        lVar5 = 0;
        do {
          lVar1 = lVar5 + 1;
          lVar5 = lVar5 + 1;
        } while (pnVar2->name_string[lVar1] != '\0');
      }
      iVar4 = nk_stricmpn(pnVar2->name_string,name,(int)lVar5);
      if (iVar4 == 0) {
        return pnVar2;
      }
      pnVar3 = pnVar2->next;
    }
  }
  __assert_fail("iter != iter->next",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x3f30,
                "struct nk_window *nk_find_window(struct nk_context *, nk_hash, const char *)");
}

Assistant:

NK_LIB struct nk_window*
nk_find_window(struct nk_context *ctx, nk_hash hash, const char *name)
{
    struct nk_window *iter;
    iter = ctx->begin;
    while (iter) {
        NK_ASSERT(iter != iter->next);
        if (iter->name == hash) {
            int max_len = nk_strlen(iter->name_string);
            if (!nk_stricmpn(iter->name_string, name, max_len))
                return iter;
        }
        iter = iter->next;
    }
    return 0;
}